

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomHeap.cpp
# Opt level: O1

bool __thiscall
Memory::CustomHeap::Heap<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>::
AllocInPage(Heap<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper> *this,
           Page *page,size_t bytes,ushort pdataCount,ushort xdataSize,Allocation **allocationOut)

{
  BucketId BVar1;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *this_00;
  _func_void *p_Var2;
  CodePageAllocators<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper> *this_01;
  code *pcVar3;
  bool bVar4;
  uint uVar5;
  Allocation *buffer;
  undefined4 *puVar6;
  ulong uVar7;
  long lVar8;
  uint length;
  ulong uVar9;
  int iVar10;
  char *functionStart;
  SecondaryAllocation element;
  byte bVar11;
  UnitWord64 bits;
  Heap<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper> *pHVar12;
  SecondaryAllocation local_68;
  XDataAllocation xdata;
  
  this_00 = &this->auxiliaryAllocator->
             super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
  p_Var2 = (this_00->super_Allocator).outOfMemoryFunc;
  (this_00->super_Allocator).outOfMemoryFunc = (_func_void *)0x0;
  xdata.super_SecondaryAllocation.address = (SecondaryAllocation)(SecondaryAllocation)page;
  buffer = (Allocation *)
           ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::AllocInternal
                     (this_00,0x38);
  (this_00->super_Allocator).outOfMemoryFunc = p_Var2;
  (buffer->xdata).super_SecondaryAllocation.address = (BYTE *)0x0;
  uVar5 = (uint)bytes;
  if (((int)uVar5 < 1) || ((uVar5 + 0x7fffffff & uVar5) != 0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/CustomHeap.cpp"
                       ,0x243,"(Math::IsPow2((int32)bytes))","Math::IsPow2((int32)bytes)");
    if (!bVar4) goto LAB_006a7cd4;
    *puVar6 = 0;
  }
  element = xdata.super_SecondaryAllocation.address;
  uVar9 = 1;
  if (0x80 < bytes) {
    uVar9 = bytes >> 7 & 0x1ffffff;
  }
  uVar7 = *(ulong *)((long)xdata.super_SecondaryAllocation.address + 0x10);
  iVar10 = -1;
  if (uVar7 != 0) {
    uVar7 = uVar7 >> 0x38 | (uVar7 & 0xff000000000000) >> 0x28 | (uVar7 & 0xff0000000000) >> 0x18 |
            (uVar7 & 0xff00000000) >> 8 | (uVar7 & 0xff000000) << 8 | (uVar7 & 0xff0000) << 0x18 |
            (uVar7 & 0xff00) << 0x28 | uVar7 << 0x38;
    uVar7 = (uVar7 & 0xf0f0f0f0f0f0f0f) << 4 | uVar7 >> 4 & 0xf0f0f0f0f0f0f0f;
    uVar7 = (uVar7 >> 2 & 0x3333333333333333) + (uVar7 & 0x3333333333333333) * 4;
    bits = (uVar7 >> 1 & 0x5555555555555555) + (uVar7 & 0x5555555555555555) * 2;
    iVar10 = 0;
    do {
      uVar5 = BVUnitT<unsigned_long>::NumLeadingZeroes(bits);
      uVar7 = bits << ((byte)uVar5 & 0x3f);
      iVar10 = iVar10 + uVar5;
      uVar5 = BVUnitT<unsigned_long>::NumLeadingZeroes(~uVar7);
      if ((uint)uVar9 <= uVar5) goto LAB_006a799f;
      bits = uVar7 << ((byte)uVar5 & 0x3f);
      iVar10 = iVar10 + uVar5;
    } while (bits != 0);
    iVar10 = -1;
  }
LAB_006a799f:
  if (iVar10 != -1) {
    functionStart = (char *)((ulong)(uint)(iVar10 << 7) + *(long *)((long)element.address + 0x18));
    local_68.address = (BYTE *)0x0;
    if (pdataCount != 0) {
      this_01 = this->codePageAllocators;
      CCLock::Enter((CCLock *)this_01);
      if ((*(long *)((long)element.address + 0x10) == 0) ||
         (((this->codePageAllocators->preReservedHeapAllocator).allocXdata == true &&
          (bVar4 = SegmentBase<Memory::VirtualAllocWrapper>::CanAllocSecondary
                             (*(SegmentBase<Memory::VirtualAllocWrapper> **)
                               ((long)element.address + 8)), !bVar4)))) {
        ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
                  (&this->auxiliaryAllocator->
                    super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>,buffer,
                   0x38);
        lVar8 = (long)*(int *)((long)element.address + 0x20);
        if (DAT_015d346a == '\x01') {
          Output::Trace(CustomHeapPhase,L"Moving page from bucket %d to full list\n",lVar8);
        }
        if (*element.address == '\x01') {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar6 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/CustomHeap.cpp"
                             ,0x25a,"(!page->inFullList)","!page->inFullList");
          if (!bVar4) goto LAB_006a7cd4;
          *puVar6 = 0;
        }
        DListBase<Memory::CustomHeap::Page,_RealCount>::MoveElementTo
                  (this->buckets + lVar8,(Page *)element.address,this->fullPages + lVar8);
        *element.address = 1;
        bVar4 = false;
        pHVar12 = (Heap<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper> *)0x0;
      }
      else {
        bVar4 = CodePageAllocators<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>
                ::AllocSecondary(this->codePageAllocators,*(void **)((long)element.address + 8),
                                 (ULONG_PTR)functionStart,bytes,pdataCount,xdataSize,&local_68);
        if (bVar4) {
          bVar4 = true;
          pHVar12 = this;
        }
        else {
          ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
                    (&this->auxiliaryAllocator->
                      super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>,
                     buffer,0x38);
          pHVar12 = (Heap<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper> *)
                    &DAT_00000001;
          bVar4 = false;
        }
      }
      bVar11 = (byte)pHVar12;
      CCLock::Leave((CCLock *)this_01);
      element = xdata.super_SecondaryAllocation.address;
      if (!bVar4) goto LAB_006a7cbe;
    }
    buffer->field_0x28 = buffer->field_0x28 & 0xfc;
    (buffer->field_0).page = (Page *)element.address;
    buffer->size = bytes;
    buffer->address = functionStart;
    buffer->thunkAddress = 0;
    this->allocationsSinceLastCompact = this->allocationsSinceLastCompact + bytes;
    this->freeObjectSize = this->freeObjectSize - bytes;
    uVar7 = (0xffffffffffffffffU >> (-(char)uVar9 & 0x3fU)) << ((byte)iVar10 & 0x3f);
    if ((uVar7 & ~((BVUnit *)(element.address + 0x10))->word) == 0) {
      ((BVUnit *)(element.address + 0x10))->word =
           ((BVUnit *)(element.address + 0x10))->word & ~uVar7;
      if (DAT_015d346a == '\x01') {
        Output::Trace(CustomHeapPhase,L"ChunkSize: %d, Index: %d, Free bit vector in page: ",uVar9);
      }
      if (DAT_015d346a == '\x01') {
        Output::Trace(CustomHeapPhase,L"\n");
      }
      if ((((BVUnit *)(element.address + 0x10))->word == 0) ||
         (((this->codePageAllocators->preReservedHeapAllocator).allocXdata == true &&
          (bVar4 = SegmentBase<Memory::VirtualAllocWrapper>::CanAllocSecondary
                             (*(SegmentBase<Memory::VirtualAllocWrapper> **)(element.address + 8)),
          !bVar4)))) {
        BVar1 = *(BucketId *)(element.address + 0x20);
        if (DAT_015d346a == '\x01') {
          Output::Trace(CustomHeapPhase,L"Moving page from bucket %d to full list\n",
                        (ulong)(uint)BVar1);
        }
        if (*element.address == '\x01') {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar6 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/CustomHeap.cpp"
                             ,0x292,"(!page->inFullList)","!page->inFullList");
          if (!bVar4) {
LAB_006a7cd4:
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          *puVar6 = 0;
        }
        DListBase<Memory::CustomHeap::Page,_RealCount>::MoveElementTo
                  (this->buckets + BVar1,(Page *)element.address,this->fullPages + BVar1);
        *element.address = '\x01';
      }
      (buffer->xdata).super_SecondaryAllocation.address = local_68.address;
      *allocationOut = buffer;
      bVar11 = 1;
      goto LAB_006a7cbe;
    }
  }
  CustomHeap_BadPageState_unrecoverable_error((ULONG_PTR)this);
  bVar11 = 0;
LAB_006a7cbe:
  return (bool)(bVar11 & 1);
}

Assistant:

bool Heap<TAlloc, TPreReservedAlloc>::AllocInPage(Page* page, size_t bytes, ushort pdataCount, ushort xdataSize, Allocation ** allocationOut)
{
    Allocation * allocation = AnewNoThrowStruct(this->auxiliaryAllocator, Allocation);
    if (allocation == nullptr)
    {
        return true;
    }

    Assert(Math::IsPow2((int32)bytes));

    uint length = GetChunkSizeForBytes(bytes);
    BVIndex index = GetFreeIndexForPage(page, bytes);
    if (index == BVInvalidIndex)
    {
        CustomHeap_BadPageState_unrecoverable_error((ULONG_PTR)this);
        return false;
    }
    char* address = page->address + Page::Alignment * index;

#if PDATA_ENABLED
    XDataAllocation xdata;
    if(pdataCount > 0)
    {
        AutoCriticalSection autoLock(&this->codePageAllocators->cs);
        if (this->ShouldBeInFullList(page))
        {
            Adelete(this->auxiliaryAllocator, allocation);
            // If we run out of XData space with the segment, move the page to the full page list, and return false to try the next page.
            BucketId bucket = page->currentBucket;
            VerboseHeapTrace(_u("Moving page from bucket %d to full list\n"), bucket);

            Assert(!page->inFullList);
            this->buckets[bucket].MoveElementTo(page, &this->fullPages[bucket]);
            page->inFullList = true;
            return false;
        }

        if (!this->codePageAllocators->AllocSecondary(page->segment, (ULONG_PTR)address, bytes, pdataCount, xdataSize, &xdata))
        {
            Adelete(this->auxiliaryAllocator, allocation);
            return true;
        }
    }
#endif

#if DBG
    allocation->isAllocationUsed = false;
    allocation->isNotExecutableBecauseOOM = false;
#endif

    allocation->page = page;
    allocation->size = bytes;
    allocation->address = address;
    allocation->thunkAddress = 0;

#if DBG_DUMP
    this->allocationsSinceLastCompact += bytes;
    this->freeObjectSize -= bytes;
#endif

    //Section of the Page should already be freed.
    if (!page->freeBitVector.TestRange(index, length))
    {
        CustomHeap_BadPageState_unrecoverable_error((ULONG_PTR)this);
        return false;
    }

    //Section of the Page should already be freed.
    if (!page->freeBitVector.TestRange(index, length))
    {
        CustomHeap_BadPageState_unrecoverable_error((ULONG_PTR)this);
        return false;
    }

    page->freeBitVector.ClearRange(index, length);
    VerboseHeapTrace(_u("ChunkSize: %d, Index: %d, Free bit vector in page: "), length, index);

#if VERBOSE_HEAP
    page->freeBitVector.DumpWord();
#endif
    VerboseHeapTrace(_u("\n"));

    if (this->ShouldBeInFullList(page))
    {
        BucketId bucket = page->currentBucket;
        VerboseHeapTrace(_u("Moving page from bucket %d to full list\n"), bucket);

        Assert(!page->inFullList);
        this->buckets[bucket].MoveElementTo(page, &this->fullPages[bucket]);
        page->inFullList = true;
    }

#if PDATA_ENABLED
    allocation->xdata = xdata;
#endif

    *allocationOut = allocation;
    return true;
}